

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrawTopStuff(DBaseStatusBar *this,EHudState state)

{
  bool bVar1;
  uint uVar2;
  int local_28;
  int local_24;
  EHudState state_local;
  DBaseStatusBar *this_local;
  
  if ((demoplayback) && (demover != 0x21e)) {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,1,0,this->ST_Y + CleanYfac * -0x28,
                      "Demo was recorded with a different version\nof ZDoom. Expect it to go out of sync."
                      ,0x40001393,1,0);
  }
  DrawPowerups(this);
  if (((automapactive & 1U) != 0) && ((viewactive & 1U) == 0)) {
    if (state == HUD_StatusBar) {
      local_24 = ST_Y;
    }
    else {
      local_24 = DCanvas::GetHeight((DCanvas *)screen);
    }
    DrawMessages(this,2,local_24);
  }
  if (state == HUD_StatusBar) {
    local_28 = ST_Y;
  }
  else {
    local_28 = DCanvas::GetHeight((DCanvas *)screen);
  }
  DrawMessages(this,0,local_28);
  DrawConsistancy(this);
  DrawWaiting(this);
  if (((this->ShowLog & 1U) != 0) &&
     (uVar2 = (*(this->super_DObject)._vptr_DObject[0x13])(this,(ulong)state), (uVar2 & 1) != 0)) {
    DrawLog(this);
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&noisedebug);
  if (bVar1) {
    S_NoiseDebug();
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawTopStuff (EHudState state)
{
	if (demoplayback && demover != DEMOGAMEVERSION)
	{
		screen->DrawText (SmallFont, CR_TAN, 0, ST_Y - 40 * CleanYfac,
			"Demo was recorded with a different version\n"
			"of " GAMENAME ". Expect it to go out of sync.",
			DTA_CleanNoMove, true, TAG_DONE);
	}

	DrawPowerups ();
	if (automapactive && !viewactive)
	{
		DrawMessages (HUDMSGLayer_OverMap, (state == HUD_StatusBar) ? ::ST_Y : SCREENHEIGHT);
	}
	DrawMessages (HUDMSGLayer_OverHUD, (state == HUD_StatusBar) ? ::ST_Y : SCREENHEIGHT);
	DrawConsistancy ();
	DrawWaiting ();
	if (ShowLog && MustDrawLog(state)) DrawLog ();

	if (noisedebug)
	{
		S_NoiseDebug ();
	}
}